

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

expression_ptr __thiscall mjs::parser::parse_property_name(parser *this)

{
  element_type *peVar1;
  int iVar2;
  pointer *__ptr;
  parser *in_RSI;
  position_stack_node _expression_position__LINE__;
  position_stack_node local_60;
  token local_40;
  
  local_60.stack_ = &in_RSI->expression_pos_;
  local_60.prev_ = in_RSI->expression_pos_;
  in_RSI->expression_pos_ = &local_60;
  local_60.pos_ = in_RSI->token_start_;
  if ((in_RSI->current_token_).type_ - numeric_literal < 2) {
    check_literal(in_RSI);
    get_token(&local_40,in_RSI);
    make_expression<mjs::literal_expression,mjs::token>(this,(token *)in_RSI);
    token::destroy(&local_40);
LAB_0016fe40:
    if (*local_60.stack_ == &local_60) {
      *local_60.stack_ = local_60.prev_;
      return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
             (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
             this;
    }
    __assert_fail("stack_ == this",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                  ,0x116,"mjs::parser::position_stack_node::~position_stack_node()");
  }
  parse_identifier_name(this,(char *)in_RSI,0x19fd84);
  peVar1 = (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (**(code **)(*(long *)peVar1 + 0x18))();
    if (iVar2 == 0) goto LAB_0016fe40;
  }
  __assert_fail("p && p->type() == expression_type::identifier",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp",
                0x436,"expression_ptr mjs::parser::parse_property_name()");
}

Assistant:

expression_ptr parser::parse_property_name() {
    RECORD_EXPRESSION_START;
    if (current_token_type() == token_type::string_literal || current_token_type() == token_type::numeric_literal) {
        check_literal();
        return make_expression<literal_expression>(get_token());
    } else {
        auto p = parse_identifier_name(__func__, __LINE__);
        assert(p && p->type() == expression_type::identifier);
        return p;
    }
}